

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_mgga_xc_b88b95.c
# Opt level: O0

void xc_hyb_mgga_xc_x1b95_init(xc_func_type *p)

{
  xc_func_type *in_RDI;
  double funcs_coef [3];
  double a0;
  double a2;
  double a1;
  
  xc_mix_init((xc_func_type *)0x3fd3333333333333,0x3ff00000,(int *)0x3fb20c49ba5e353f,
              (double *)0x3fc9eb851eb851ec);
  xc_hyb_init_hybrid(in_RDI,0.3);
  return;
}

Assistant:

void
xc_hyb_mgga_xc_x1b95_init(xc_func_type *p)
{
  const double a1=0.675, a2=0.235, a0=0.30;

  static int   funcs_id  [3] = {XC_GGA_X_B88, XC_GGA_X_PW91, XC_MGGA_C_BC95};
  double funcs_coef[3];

  funcs_coef[0] = a0*a1;
  funcs_coef[1] = a0*a2;
  funcs_coef[2] = 1.0;

  xc_mix_init(p, 3, funcs_id, funcs_coef);
  xc_hyb_init_hybrid(p, a0);
}